

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.h
# Opt level: O2

void __thiscall AccountInfoWrap::AccountInfoWrap(AccountInfoWrap *this,AccountInfo *orig)

{
  AccountInfo *this_00;
  string *psVar1;
  char *pcVar2;
  
  this_00 = &this->m_orig;
  tquant::api::AccountInfo::AccountInfo(this_00,orig);
  pcVar2 = _T(&this_00->account_id,&this_00->account_id);
  this->account_id = pcVar2;
  psVar1 = &(this->m_orig).broker;
  pcVar2 = _T(psVar1,psVar1);
  this->broker = pcVar2;
  psVar1 = &(this->m_orig).account;
  pcVar2 = _T(psVar1,psVar1);
  this->account = pcVar2;
  psVar1 = &(this->m_orig).status;
  pcVar2 = _T(psVar1,psVar1);
  this->status = pcVar2;
  psVar1 = &(this->m_orig).msg;
  pcVar2 = _T(psVar1,psVar1);
  this->msg = pcVar2;
  psVar1 = &(this->m_orig).account_type;
  pcVar2 = _T(psVar1,psVar1);
  this->account_type = pcVar2;
  return;
}

Assistant:

AccountInfoWrap(const AccountInfo& orig) : m_orig(orig)
    {
        account_id   = _T( m_orig.account_id   , m_orig.account_id  );
        broker       = _T( m_orig.broker       , m_orig.broker      );
        account      = _T( m_orig.account      , m_orig.account     );
        status       = _T( m_orig.status       , m_orig.status      );
        msg          = _T( m_orig.msg          , m_orig.msg         );
        account_type = _T( m_orig.account_type , m_orig.account_type);
    }